

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindLinks(lemon *lemp)

{
  state *psVar1;
  config *local_48;
  config *local_40;
  plink *local_38;
  plink *plp;
  state *stp;
  config *other;
  config *cfp;
  int i;
  lemon *lemp_local;
  
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    psVar1 = lemp->sorted[cfp._4_4_];
    if (psVar1 == (state *)0x0) {
      local_40 = (config *)0x0;
    }
    else {
      local_40 = psVar1->cfp;
    }
    for (other = local_40; other != (config *)0x0; other = other->next) {
      other->stp = psVar1;
    }
  }
  for (cfp._4_4_ = 0; cfp._4_4_ < lemp->nstate; cfp._4_4_ = cfp._4_4_ + 1) {
    if (lemp->sorted[cfp._4_4_] == (state *)0x0) {
      local_48 = (config *)0x0;
    }
    else {
      local_48 = lemp->sorted[cfp._4_4_]->cfp;
    }
    for (other = local_48; other != (config *)0x0; other = other->next) {
      for (local_38 = other->bplp; local_38 != (plink *)0x0; local_38 = local_38->next) {
        Plink_add(&local_38->cfp->fplp,other);
      }
    }
  }
  return;
}

Assistant:

void FindLinks(struct lemon *lemp)
{
  int i;
  struct config *cfp, *other;
  struct state *stp;
  struct plink *plp;

  /* Housekeeping detail:
  ** Add to every propagate link a pointer back to the state to
  ** which the link is attached. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      cfp->stp = stp;
    }
  }

  /* Convert all backlinks into forward links.  Only the forward
  ** links are used in the follow-set computation. */
  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    for(cfp=stp?stp->cfp:0; cfp; cfp=cfp->next){
      for(plp=cfp->bplp; plp; plp=plp->next){
        other = plp->cfp;
        Plink_add(&other->fplp,cfp);
      }
    }
  }
}